

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginTabItem(char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  short sVar1;
  ImGuiTabBar *tab_bar;
  ImGuiTabItem *pIVar2;
  ImGuiWindow *pIVar3;
  uint *__src;
  ImGuiContext *pIVar4;
  bool bVar5;
  int iVar6;
  uint *__dest;
  int iVar7;
  int iVar8;
  
  pIVar4 = GImGui;
  if (GImGui->CurrentWindow->SkipItems == false) {
    tab_bar = (GImGui->CurrentTabBar).Data[(long)(GImGui->CurrentTabBar).Size + -1];
    bVar5 = TabItemEx(tab_bar,label,p_open,flags);
    if (((flags & 8U) == 0) && (bVar5)) {
      sVar1 = tab_bar->LastTabItemIdx;
      pIVar2 = (tab_bar->Tabs).Data;
      pIVar3 = pIVar4->CurrentWindow;
      iVar6 = (pIVar3->IDStack).Size;
      if (iVar6 == (pIVar3->IDStack).Capacity) {
        if (iVar6 == 0) {
          iVar7 = 8;
        }
        else {
          iVar7 = iVar6 / 2 + iVar6;
        }
        iVar8 = iVar6 + 1;
        if (iVar6 + 1 < iVar7) {
          iVar8 = iVar7;
        }
        __dest = (uint *)MemAlloc((long)iVar8 << 2);
        __src = (pIVar3->IDStack).Data;
        if (__src != (uint *)0x0) {
          memcpy(__dest,__src,(long)(pIVar3->IDStack).Size << 2);
          MemFree((pIVar3->IDStack).Data);
        }
        (pIVar3->IDStack).Data = __dest;
        (pIVar3->IDStack).Capacity = iVar8;
        iVar6 = (pIVar3->IDStack).Size;
      }
      else {
        __dest = (pIVar3->IDStack).Data;
      }
      __dest[iVar6] = pIVar2[sVar1].ID;
      (pIVar3->IDStack).Size = (pIVar3->IDStack).Size + 1;
      bVar5 = true;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool    ImGui::BeginTabItem(const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (g.CurrentWindow->SkipItems)
        return false;

    IM_ASSERT(g.CurrentTabBar.Size > 0 && "Needs to be called between BeginTabBar() and EndTabBar()!");
    ImGuiTabBar* tab_bar = g.CurrentTabBar.back();
    bool ret = TabItemEx(tab_bar, label, p_open, flags);
    if (ret && !(flags & ImGuiTabItemFlags_NoPushId))
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_bar->LastTabItemIdx];
        g.CurrentWindow->IDStack.push_back(tab->ID);    // We already hashed 'label' so push into the ID stack directly instead of doing another hash through PushID(label)
    }
    return ret;
}